

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_api.cc
# Opt level: O1

int XLearnPredictForMat(XL *out,char *model_path,uint64 *length,float **out_arr)

{
  Solver *this;
  HyperParam *hyper_param;
  pointer pfVar1;
  ostream *poVar2;
  float fVar3;
  Modifier reset;
  Modifier bold;
  Modifier green;
  Timer timer;
  Modifier local_64;
  Modifier local_60;
  Modifier local_5c;
  undefined1 local_58 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  Timer local_38;
  
  Timer::Timer(&local_38);
  Timer::tic(&local_38);
  hyper_param = (HyperParam *)*out;
  std::__cxx11::string::string((string *)local_58,model_path,(allocator *)&local_5c);
  std::__cxx11::string::operator=((string *)&hyper_param->model_file,(string *)local_58);
  if ((undefined1 *)local_58._0_8_ != local_58 + 0x10) {
    operator_delete((void *)local_58._0_8_);
  }
  hyper_param->res_out = false;
  hyper_param->is_train = false;
  this = (Solver *)(hyper_param + 1);
  xLearn::Solver::Initialize(this,hyper_param);
  (this->hyper_param_).is_train = false;
  xLearn::Solver::StartWork(this);
  if (XLearnPredictForMat::tmp_preds == '\0') {
    XLearnPredictForMat_cold_1();
  }
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_58,
             (vector<float,_std::allocator<float>_> *)&hyper_param[2].opt_type.field_2);
  pfVar1 = XLearnPredictForMat::tmp_preds.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  XLearnPredictForMat::tmp_preds.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)local_48._M_allocated_capacity;
  XLearnPredictForMat::tmp_preds.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_58._0_8_;
  XLearnPredictForMat::tmp_preds.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)local_58._8_8_;
  local_58 = ZEXT816(0) << 0x20;
  local_48._M_allocated_capacity = 0;
  if (pfVar1 != (pointer)0x0) {
    operator_delete(pfVar1);
  }
  if ((pointer)local_58._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_58._0_8_);
  }
  *out_arr = XLearnPredictForMat::tmp_preds.super__Vector_base<float,_std::allocator<float>_>.
             _M_impl.super__Vector_impl_data._M_start;
  *length = (long)XLearnPredictForMat::tmp_preds.super__Vector_base<float,_std::allocator<float>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)XLearnPredictForMat::tmp_preds.super__Vector_base<float,_std::allocator<float>_>.
                  _M_impl.super__Vector_impl_data._M_start >> 2;
  xLearn::Solver::Clear(this);
  fVar3 = Timer::toc(&local_38);
  StringPrintf_abi_cxx11_((string *)local_58,"Total time cost: %.2f (sec)",(double)fVar3);
  local_5c.code = FG_GREEN;
  local_60.code = BOLD;
  local_64.code = RESET;
  poVar2 = Color::operator<<((ostream *)&std::cout,&local_5c);
  poVar2 = Color::operator<<(poVar2,&local_60);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"[------------] ",0xf);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,(char *)local_58._0_8_,local_58._8_8_);
  poVar2 = Color::operator<<(poVar2,&local_64);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  if ((undefined1 *)local_58._0_8_ != local_58 + 0x10) {
    operator_delete((void *)local_58._0_8_);
  }
  return 0;
}

Assistant:

XL_DLL int XLearnPredictForMat(XL *out, const char *model_path, 
                               uint64 *length,
                               const float** out_arr) {
  API_BEGIN();
  Timer timer;
  timer.tic();
  XLearn* xl = reinterpret_cast<XLearn*>(*out);
  xl->GetHyperParam().model_file = std::string(model_path);
  xl->GetHyperParam().res_out = false;
  xl->GetHyperParam().is_train = false;
  xl->GetSolver().Initialize(xl->GetHyperParam());
  xl->GetSolver().SetPredict();
  xl->GetSolver().StartWork();
  static std::vector<real_t> tmp_preds;
  tmp_preds = xl->GetSolver().GetResult();
  std::vector<real_t> &preds = tmp_preds;
  *out_arr = &preds[0];
  *length = static_cast<uint64>(preds.size());
  xl->GetSolver().Clear();
  Color::print_info(
    StringPrintf("Total time cost: %.2f (sec)", 
    timer.toc()), true);
  API_END();
}